

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O1

bool __thiscall QHttpHeaders::append(QHttpHeaders *this,WellKnownHeader name,QAnyStringView value)

{
  QList<Header> *this_00;
  QHttpHeadersPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  anon_class_1_0_00000001 local_71;
  _Variadic_union<QHttpHeaders::WellKnownHeader,_QByteArray> local_70;
  char local_58;
  QByteArray local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar2 = isValidHttpHeaderValueField(value);
  if (bVar2) {
    QExplicitlySharedDataPointer<QHttpHeadersPrivate>::detach(&this->d);
    pQVar1 = (this->d).d.ptr;
    this_00 = &pQVar1->headers;
    local_58 = '\0';
    local_70._M_first._M_storage = (_Uninitialized<QHttpHeaders::WellKnownHeader,_true>)name;
    normalizedValue(&local_50,value);
    QtPrivate::QGenericArrayOps<Header>::emplace<Header>
              ((QGenericArrayOps<Header> *)this_00,(pQVar1->headers).d.size,
               (Header *)&local_70._M_first);
    QList<Header>::end(this_00);
    if (&(local_50.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.d.d)->super_QArrayData,1,0x10);
      }
    }
    if ((long)local_58 != -1) {
      (*std::__detail::__variant::
        __gen_vtable<void,_(lambda_at_/usr/lib/gcc/x86_64-linux-gnu/11/../../../../include/c++/11/variant:427:24)_&&,_std::variant<QHttpHeaders::WellKnownHeader,_QByteArray>_&>
        ::_S_vtable._M_arr[local_58]._M_data)
                (&local_71,(variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)&local_70);
      local_58 = -1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QHttpHeaders::append(WellKnownHeader name, QAnyStringView value)
{
    if (!isValidHttpHeaderValueField(value))
        return false;

    d.detach();
    d->headers.push_back({HeaderName{name}, normalizedValue(value)});
    return true;
}